

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall duckdb::ScanFilterInfo::CheckAllFilters(ScanFilterInfo *this)

{
  pointer pSVar1;
  ScanFilter *filter;
  pointer pSVar2;
  idx_t col_idx;
  ulong __n;
  reference local_50;
  reference local_40;
  
  this->always_true_filters = 0;
  for (__n = 0; __n < (ulong)*(uint *)((long)&(this->column_has_filter).
                                              super_vector<bool,_std::allocator<bool>_>.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base + 8) +
                      ((long)(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    local_40 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&(this->base_column_has_filter).super_vector<bool,_std::allocator<bool>_>,
                          __n);
    local_50 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>,__n);
    ::std::_Bit_reference::operator=(&local_50,&local_40);
  }
  pSVar1 = (this->filter_list).super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
           .super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->filter_list).
                super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    pSVar2->always_true = false;
  }
  return;
}

Assistant:

void ScanFilterInfo::CheckAllFilters() {
	always_true_filters = 0;
	// reset the "column_has_filter" bitmask to the original
	for (idx_t col_idx = 0; col_idx < column_has_filter.size(); col_idx++) {
		column_has_filter[col_idx] = base_column_has_filter[col_idx];
	}
	// set "always_true" in the individual filters to false
	for (auto &filter : filter_list) {
		filter.always_true = false;
	}
}